

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

void TTD::NSSnapObjects::
     StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapBoundFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)8>
               (SnapObject *snpObject,SnapBoundFunctionInfo *addtlInfo,SlabAllocator *alloc,
               uint32 dependsOnArrayCount,TTD_PTR_ID *dependsOnArray)

{
  DependsOnInfo *pDVar1;
  TTD_PTR_ID *dependsOnArray_local;
  uint32 dependsOnArrayCount_local;
  SlabAllocator *alloc_local;
  SnapBoundFunctionInfo *addtlInfo_local;
  SnapObject *snpObject_local;
  
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapBoundFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)8>
            (snpObject,addtlInfo);
  if ((dependsOnArrayCount != 0) && (dependsOnArray != (TTD_PTR_ID *)0x0)) {
    pDVar1 = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::DependsOnInfo>(alloc);
    snpObject->OptDependsOnInfo = pDVar1;
    snpObject->OptDependsOnInfo->DepOnCount = dependsOnArrayCount;
    snpObject->OptDependsOnInfo->DepOnPtrArray = dependsOnArray;
    return;
  }
  TTDAbort_unrecoverable_error("Why are you calling this then?");
}

Assistant:

void StdExtractSetKindSpecificInfo(SnapObject* snpObject, T addtlInfo, SlabAllocator& alloc, uint32 dependsOnArrayCount, TTD_PTR_ID* dependsOnArray)
        {
            SnapObjectSetAddtlInfoAs<T, tag>(snpObject, addtlInfo);

            TTDAssert(dependsOnArrayCount != 0 && dependsOnArray != nullptr, "Why are you calling this then?");

            snpObject->OptDependsOnInfo = alloc.SlabAllocateStruct<DependsOnInfo>();
            snpObject->OptDependsOnInfo->DepOnCount = dependsOnArrayCount;
            snpObject->OptDependsOnInfo->DepOnPtrArray = dependsOnArray;
        }